

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundex.cpp
# Opt level: O2

string * Soundex::encodeString(string *__return_storage_ptr__,string *word)

{
  bool bVar1;
  int iVar2;
  char *c_00;
  char *c_01;
  ulong uVar3;
  char c;
  char prevChar;
  string prevEncoding;
  string nextEncoding;
  
  toupper((int)*(word->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uVar3 = 1;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  prevChar = '\0';
  encodeChar_abi_cxx11_(&prevEncoding,(Soundex *)(__return_storage_ptr__->_M_dataplus)._M_p,c_00);
  do {
    if (word->_M_string_length <= uVar3) {
      std::__cxx11::string::~string((string *)&prevEncoding);
      return __return_storage_ptr__;
    }
    iVar2 = toupper((int)(word->_M_dataplus)._M_p[uVar3]);
    c = (char)iVar2;
    encodeChar_abi_cxx11_(&nextEncoding,(Soundex *)&c,c_01);
    bVar1 = std::operator!=(&nextEncoding,"");
    if (bVar1) {
      bVar1 = isVowel(&prevChar);
      if (!bVar1) {
        bVar1 = std::operator!=(&nextEncoding,&prevEncoding);
        if (!bVar1) goto LAB_0010371b;
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::_M_assign((string *)&prevEncoding);
    }
LAB_0010371b:
    prevChar = c;
    std::__cxx11::string::~string((string *)&nextEncoding);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

string Soundex::encodeString(const string &word) {
    string encoded = string(1, toupper(word[0]));
    char prevChar = 0;
    string prevEncoding = encodeChar(encoded[0]);
    for (int i = 1; i < word.length(); i++) {
        char c = toupper(word[i]);
        string nextEncoding = encodeChar(c);
        if (nextEncoding != "" && (isVowel(prevChar) || nextEncoding != prevEncoding)) {
            encoded += nextEncoding;
            prevEncoding = nextEncoding;
        }
        prevChar = c;
    }
    return encoded;
}